

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O3

void __thiscall cmInstallExportGenerator::GenerateScript(cmInstallExportGenerator *this,ostream *os)

{
  cmExportInstallFileGenerator *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  pointer pbVar2;
  ostream *poVar3;
  const_iterator __begin2;
  pointer config;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  ostringstream e;
  string local_1f0;
  string local_1c0;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  size_type local_180;
  pointer local_178;
  ios_base local_130 [264];
  
  if ((this->ExportSet->TargetExports).
      super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->ExportSet->TargetExports).
      super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"INSTALL(EXPORT) given unknown export \"",0x26);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,(this->ExportSet->Name)._M_dataplus._M_p,
                        (this->ExportSet->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,
                      CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                               local_1f0.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  else {
    ComputeTempDir(this);
    cmsys::SystemTools::MakeDirectory(&this->TempDir,(mode_t *)0x0);
    local_1a0._8_8_ = (this->TempDir)._M_dataplus._M_p;
    local_1a0._0_8_ = (this->TempDir)._M_string_length;
    local_1f0._M_string_length = (size_type)&local_1f0.field_2;
    local_1f0._M_dataplus._M_p = (pointer)0x1;
    local_1f0.field_2._M_local_buf[0] = '/';
    local_190._M_allocated_capacity = 1;
    local_178 = (this->FileName)._M_dataplus._M_p;
    local_180 = (this->FileName)._M_string_length;
    views._M_len = 3;
    views._M_array = (iterator)local_1a0;
    local_190._8_8_ = local_1f0._M_string_length;
    cmCatViews_abi_cxx11_(&local_1c0,views);
    std::__cxx11::string::operator=((string *)&this->MainImportFile,(string *)&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    cmExportFileGenerator::SetExportFile
              (&((this->EFGen)._M_t.
                 super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
                 .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl)->
                super_cmExportFileGenerator,(this->MainImportFile)._M_dataplus._M_p);
    std::__cxx11::string::_M_assign
              ((string *)
               &(((this->EFGen)._M_t.
                  super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
                  .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl)->
                super_cmExportFileGenerator).Namespace);
    this_00 = (this->EFGen)._M_t.
              super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
              .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl;
    (this_00->super_cmExportFileGenerator).ExportOld = this->ExportOld;
    pvVar1 = (this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationTypes;
    config = (pvVar1->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (pvVar1->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (config == pbVar2) {
      if ((this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationName.
          _M_string_length == 0) {
        local_1a0._0_8_ = &local_190;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"");
        cmExportFileGenerator::AddConfiguration
                  (&this_00->super_cmExportFileGenerator,(string *)local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._0_8_ != &local_190) {
          operator_delete((void *)local_1a0._0_8_,local_190._M_allocated_capacity + 1);
        }
      }
      else {
        cmExportFileGenerator::AddConfiguration
                  (&this_00->super_cmExportFileGenerator,
                   &(this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationName);
      }
    }
    else {
      do {
        cmExportFileGenerator::AddConfiguration
                  (&((this->EFGen)._M_t.
                     super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
                     .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl)->
                    super_cmExportFileGenerator,config);
        config = config + 1;
      } while (config != pbVar2);
    }
    cmExportFileGenerator::GenerateImportFile
              (&((this->EFGen)._M_t.
                 super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
                 .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl)->
                super_cmExportFileGenerator);
    cmInstallGenerator::GenerateScript(&this->super_cmInstallGenerator,os);
  }
  return;
}

Assistant:

void cmInstallExportGenerator::GenerateScript(std::ostream& os)
{
  // Skip empty sets.
  if (this->ExportSet->GetTargetExports().empty()) {
    std::ostringstream e;
    e << "INSTALL(EXPORT) given unknown export \""
      << this->ExportSet->GetName() << "\"";
    cmSystemTools::Error(e.str());
    return;
  }

  // Create the temporary directory in which to store the files.
  this->ComputeTempDir();
  cmSystemTools::MakeDirectory(this->TempDir);

  // Construct a temporary location for the file.
  this->MainImportFile = cmStrCat(this->TempDir, '/', this->FileName);

  // Generate the import file for this export set.
  this->EFGen->SetExportFile(this->MainImportFile.c_str());
  this->EFGen->SetNamespace(this->Namespace);
  this->EFGen->SetExportOld(this->ExportOld);
  if (this->ConfigurationTypes->empty()) {
    if (!this->ConfigurationName.empty()) {
      this->EFGen->AddConfiguration(this->ConfigurationName);
    } else {
      this->EFGen->AddConfiguration("");
    }
  } else {
    for (std::string const& c : *this->ConfigurationTypes) {
      this->EFGen->AddConfiguration(c);
    }
  }
  this->EFGen->GenerateImportFile();

  // Perform the main install script generation.
  this->cmInstallGenerator::GenerateScript(os);
}